

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O1

void __thiscall
Eigen::SparseMatrix<float,1,int>::reserveInnerVectors<Eigen::Matrix<int,_1,1,0,_1,1>>
          (SparseMatrix<float,1,int> *this,Matrix<int,__1,_1,_0,__1,_1> *reserveSizes)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int *piVar8;
  long lVar9;
  void *__ptr;
  bool bVar10;
  void *pvVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  undefined8 *puVar15;
  ulong uVar16;
  int iVar17;
  Index size;
  int iVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  
  uVar6 = *(ulong *)(this + 8);
  lVar7 = *(long *)(this + 0x20);
  if (lVar7 == 0) {
    pvVar11 = malloc(uVar6 * 4);
    *(void **)(this + 0x20) = pvVar11;
    if (pvVar11 != (void *)0x0) {
      uVar12 = 0;
      if ((long)uVar6 < 1) {
        size = 0;
      }
      else {
        piVar8 = (reserveSizes->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        uVar16 = (reserveSizes->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                 m_storage.m_rows;
        lVar7 = *(long *)(this + 0x18);
        if ((long)uVar16 < 1) {
          uVar16 = uVar12;
        }
        size = 0;
        uVar19 = 0;
        do {
          *(int *)((long)pvVar11 + uVar19 * 4) = (int)uVar12;
          if (uVar16 == uVar19) goto LAB_0015f8bb;
          iVar17 = piVar8[uVar19];
          uVar12 = (ulong)(uint)(((int)uVar12 + iVar17 + *(int *)(lVar7 + 4 + uVar19 * 4)) -
                                *(int *)(lVar7 + uVar19 * 4));
          uVar19 = uVar19 + 1;
          size = size + iVar17;
        } while (uVar6 != uVar19);
      }
      internal::CompressedStorage<float,_int>::reserve
                ((CompressedStorage<float,_int> *)(this + 0x28),size);
      lVar7 = *(long *)(this + 8);
      lVar9 = *(long *)(this + 0x18);
      if (0 < lVar7) {
        iVar17 = *(int *)(lVar9 + lVar7 * 4);
        lVar1 = *(long *)(this + 0x30);
        lVar3 = *(long *)(this + 0x20);
        lVar13 = *(long *)(this + 0x28);
        lVar14 = lVar7;
        do {
          lVar21 = lVar14 + -1;
          lVar20 = (long)iVar17 - (long)*(int *)(lVar9 + -4 + lVar14 * 4);
          if (0 < (int)lVar20) {
            lVar22 = lVar1 + lVar20 * 4;
            lVar24 = lVar13 + lVar20 * 4;
            lVar23 = 1;
            do {
              lVar22 = lVar22 + -4;
              lVar24 = lVar24 + -4;
              *(undefined4 *)(lVar22 + (long)*(int *)((long)pvVar11 + lVar21 * 4) * 4) =
                   *(undefined4 *)(lVar22 + (long)*(int *)(lVar9 + lVar21 * 4) * 4);
              *(undefined4 *)(lVar24 + (long)*(int *)((long)pvVar11 + lVar21 * 4) * 4) =
                   *(undefined4 *)(lVar24 + (long)*(int *)(lVar9 + lVar21 * 4) * 4);
              lVar2 = lVar20 + -1 + lVar23;
              lVar23 = lVar23 + -1;
            } while (lVar2 != 1 && -1 < lVar2 + -1);
          }
          iVar17 = *(int *)(lVar9 + lVar21 * 4);
          *(undefined4 *)(lVar9 + lVar21 * 4) = *(undefined4 *)((long)pvVar11 + lVar21 * 4);
          *(int *)(lVar3 + lVar21 * 4) = (int)lVar20;
          bVar10 = 1 < lVar14;
          lVar14 = lVar21;
        } while (bVar10);
      }
      if (0 < lVar7) {
        if ((reserveSizes->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
            m_rows < lVar7) {
LAB_0015f8bb:
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0xa3,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<int, -1, 1>, Level = 0]"
                       );
        }
        *(int *)(lVar9 + lVar7 * 4) =
             *(int *)(*(long *)(this + 0x20) + -4 + lVar7 * 4) + *(int *)(lVar9 + -4 + lVar7 * 4) +
             (reserveSizes->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
             m_data[lVar7 + -1];
      }
      internal::CompressedStorage<float,_int>::resize
                ((CompressedStorage<float,_int> *)(this + 0x28),(long)*(int *)(lVar9 + lVar7 * 4),
                 0.0);
      return;
    }
  }
  else {
    pvVar11 = malloc(uVar6 * 4 + 4);
    if (pvVar11 != (void *)0x0) {
      if ((long)uVar6 < 1) {
        iVar17 = 0;
      }
      else {
        piVar8 = (reserveSizes->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        uVar16 = (reserveSizes->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                 m_storage.m_rows;
        lVar9 = *(long *)(this + 0x18);
        uVar12 = 0;
        if ((long)uVar16 < 1) {
          uVar16 = uVar12;
        }
        iVar17 = 0;
        do {
          *(int *)((long)pvVar11 + uVar12 * 4) = iVar17;
          if (uVar16 == uVar12) goto LAB_0015f8bb;
          lVar3 = uVar12 * 4;
          iVar4 = *(int *)(lVar7 + uVar12 * 4);
          lVar1 = uVar12 * 4;
          iVar5 = piVar8[uVar12];
          uVar12 = uVar12 + 1;
          iVar18 = *(int *)(lVar9 + 4 + lVar3) - (*(int *)(lVar9 + lVar1) + iVar4);
          if (iVar18 < iVar5) {
            iVar18 = iVar5;
          }
          iVar17 = iVar17 + iVar4 + iVar18;
        } while (uVar6 != uVar12);
      }
      *(int *)((long)pvVar11 + uVar6 * 4) = iVar17;
      internal::CompressedStorage<float,_int>::resize
                ((CompressedStorage<float,_int> *)(this + 0x28),(long)iVar17,0.0);
      if (0 < *(long *)(this + 8)) {
        lVar7 = *(long *)(this + 0x18);
        lVar9 = *(long *)(this + 0x20);
        lVar1 = *(long *)(this + 0x30);
        lVar3 = *(long *)(this + 0x28);
        lVar13 = *(long *)(this + 8);
        do {
          lVar14 = lVar13 + -1;
          if ((*(int *)(lVar7 + -4 + lVar13 * 4) < *(int *)((long)pvVar11 + lVar13 * 4 + -4)) &&
             (lVar21 = (long)*(int *)(lVar9 + lVar14 * 4), 0 < lVar21)) {
            lVar20 = lVar1 + lVar21 * 4;
            lVar22 = lVar3 + lVar21 * 4;
            lVar24 = 1;
            do {
              lVar22 = lVar22 + -4;
              lVar20 = lVar20 + -4;
              *(undefined4 *)(lVar20 + (long)*(int *)((long)pvVar11 + lVar14 * 4) * 4) =
                   *(undefined4 *)(lVar20 + (long)*(int *)(lVar7 + lVar14 * 4) * 4);
              *(undefined4 *)(lVar22 + (long)*(int *)((long)pvVar11 + lVar14 * 4) * 4) =
                   *(undefined4 *)(lVar22 + (long)*(int *)(lVar7 + lVar14 * 4) * 4);
              lVar23 = lVar21 + -1 + lVar24;
              lVar24 = lVar24 + -1;
            } while (lVar23 != 1 && -1 < lVar23 + -1);
          }
          bVar10 = 1 < lVar13;
          lVar13 = lVar14;
        } while (bVar10);
      }
      __ptr = *(void **)(this + 0x18);
      *(void **)(this + 0x18) = pvVar11;
      free(__ptr);
      return;
    }
  }
  puVar15 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar15 = boost::program_options::detail::cmdline::cmdline;
  __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

inline void reserveInnerVectors(const SizesType& reserveSizes)
    {
      if(isCompressed())
      {
        Index totalReserveSize = 0;
        // turn the matrix into non-compressed mode
        m_innerNonZeros = static_cast<StorageIndex*>(std::malloc(m_outerSize * sizeof(StorageIndex)));
        if (!m_innerNonZeros) internal::throw_std_bad_alloc();
        
        // temporarily use m_innerSizes to hold the new starting points.
        StorageIndex* newOuterIndex = m_innerNonZeros;
        
        StorageIndex count = 0;
        for(Index j=0; j<m_outerSize; ++j)
        {
          newOuterIndex[j] = count;
          count += reserveSizes[j] + (m_outerIndex[j+1]-m_outerIndex[j]);
          totalReserveSize += reserveSizes[j];
        }
        m_data.reserve(totalReserveSize);
        StorageIndex previousOuterIndex = m_outerIndex[m_outerSize];
        for(Index j=m_outerSize-1; j>=0; --j)
        {
          StorageIndex innerNNZ = previousOuterIndex - m_outerIndex[j];
          for(Index i=innerNNZ-1; i>=0; --i)
          {
            m_data.index(newOuterIndex[j]+i) = m_data.index(m_outerIndex[j]+i);
            m_data.value(newOuterIndex[j]+i) = m_data.value(m_outerIndex[j]+i);
          }
          previousOuterIndex = m_outerIndex[j];
          m_outerIndex[j] = newOuterIndex[j];
          m_innerNonZeros[j] = innerNNZ;
        }
        if(m_outerSize>0)
          m_outerIndex[m_outerSize] = m_outerIndex[m_outerSize-1] + m_innerNonZeros[m_outerSize-1] + reserveSizes[m_outerSize-1];
        
        m_data.resize(m_outerIndex[m_outerSize]);
      }
      else
      {
        StorageIndex* newOuterIndex = static_cast<StorageIndex*>(std::malloc((m_outerSize+1)*sizeof(StorageIndex)));
        if (!newOuterIndex) internal::throw_std_bad_alloc();
        
        StorageIndex count = 0;
        for(Index j=0; j<m_outerSize; ++j)
        {
          newOuterIndex[j] = count;
          StorageIndex alreadyReserved = (m_outerIndex[j+1]-m_outerIndex[j]) - m_innerNonZeros[j];
          StorageIndex toReserve = std::max<StorageIndex>(reserveSizes[j], alreadyReserved);
          count += toReserve + m_innerNonZeros[j];
        }
        newOuterIndex[m_outerSize] = count;
        
        m_data.resize(count);
        for(Index j=m_outerSize-1; j>=0; --j)
        {
          Index offset = newOuterIndex[j] - m_outerIndex[j];
          if(offset>0)
          {
            StorageIndex innerNNZ = m_innerNonZeros[j];
            for(Index i=innerNNZ-1; i>=0; --i)
            {
              m_data.index(newOuterIndex[j]+i) = m_data.index(m_outerIndex[j]+i);
              m_data.value(newOuterIndex[j]+i) = m_data.value(m_outerIndex[j]+i);
            }
          }
        }
        
        std::swap(m_outerIndex, newOuterIndex);
        std::free(newOuterIndex);
      }
      
    }